

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  int iVar1;
  ZSTD_DCtx_s *in_RDI;
  int unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  ZSTD_longOffset_e in_stack_00000550;
  int in_stack_00000558;
  undefined8 local_8;
  
  iVar1 = ZSTD_DCtx_get_bmi2(in_RDI);
  if (iVar1 == 0) {
    local_8 = ZSTD_decompressSequences_default
                        ((ZSTD_DCtx *)maxDstSize,seqStart,seqSize,
                         (void *)CONCAT44(nbSeq,in_stack_00000010),
                         CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                         in_stack_00000550,in_stack_00000558);
  }
  else {
    local_8 = ZSTD_decompressSequences_bmi2
                        ((ZSTD_DCtx *)maxDstSize,seqStart,seqSize,
                         (void *)CONCAT44(nbSeq,in_stack_00000010),
                         CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                         in_stack_00000550,in_stack_00000558);
  }
  return local_8;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset,
                   const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
    return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}